

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
     *this,int i)

{
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *pFVar2;
  long lVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  double *pdVar6;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (pFVar1->fadexpr_).left_;
  lVar3 = *(long *)(pFVar2->fadexpr_).left_;
  pdVar6 = (double *)(lVar3 + 0x18);
  if (*(int *)(lVar3 + 8) != 0) {
    pdVar6 = (double *)(*(long *)(lVar3 + 0x10) + (long)i * 8);
  }
  pFVar4 = (pFVar2->fadexpr_).right_;
  pdVar5 = &pFVar4->defaultVal;
  if ((pFVar4->dx_).num_elts != 0) {
    pdVar5 = (pFVar4->dx_).ptr_to_data + i;
  }
  return ((*pdVar5 - *pdVar6) * (pFVar1->fadexpr_).right_.constant_ *
         (this->left_->fadexpr_).right_.constant_) / (this->right_).constant_;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) / right_.val();}